

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

bool __thiscall QListModel::removeRows(QListModel *this,int row,int count,QModelIndex *parent)

{
  int iVar1;
  QListWidgetItem *pQVar2;
  int in_EDX;
  int in_ESI;
  QList<QListWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  int r;
  QListWidgetItem *itm;
  QModelIndex *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  bool local_65;
  int local_64;
  bool local_39;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_65 = true;
  if ((0 < in_EDX) && (local_65 = true, -1 < in_ESI)) {
    in_stack_ffffffffffffff8c = in_ESI + in_EDX;
    QModelIndex::QModelIndex((QModelIndex *)0x89aba8);
    iVar1 = (*(code *)(in_RDI->d).d[7].super_QArrayData.alloc)(in_RDI,local_20);
    local_65 = true;
    if (in_stack_ffffffffffffff8c <= iVar1) {
      local_65 = QModelIndex::isValid(in_stack_ffffffffffffff80);
    }
  }
  if (local_65 == false) {
    QModelIndex::QModelIndex((QModelIndex *)0x89abf4);
    QAbstractItemModel::beginRemoveRows((QModelIndex *)in_RDI,(int)local_38,in_ESI);
    for (local_64 = in_ESI; local_64 < in_ESI + in_EDX; local_64 = local_64 + 1) {
      pQVar2 = QList<QListWidgetItem_*>::takeAt
                         (in_RDI,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      pQVar2->view = (QListWidget *)0x0;
      pQVar2->d->theid = -1;
      if (pQVar2 != (QListWidgetItem *)0x0) {
        (*pQVar2->_vptr_QListWidgetItem[1])();
      }
    }
    QAbstractItemModel::endRemoveRows();
    local_39 = true;
  }
  else {
    local_39 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::removeRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || (row + count) > rowCount() || parent.isValid())
        return false;

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    QListWidgetItem *itm = nullptr;
    for (int r = row; r < row + count; ++r) {
        itm = items.takeAt(row);
        itm->view = nullptr;
        itm->d->theid = -1;
        delete itm;
    }
    endRemoveRows();
    return true;
}